

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall absl::lts_20250127::log_internal::LogMessage::Flush(LogMessage *this)

{
  LogSeverity LVar1;
  LogMessageData *pLVar2;
  bool bVar3;
  LogSeverityAtLeast LVar4;
  LogMessage *pLVar5;
  LogMessageData *pLVar6;
  Span<char> *pSVar7;
  int errnum;
  bool expected_seen_fatal;
  
  LVar1 = (((this->data_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl)->entry).severity_;
  LVar4 = MinLogLevel();
  if ((int)LVar4 <= (int)LVar1) {
    pLVar6 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if (pLVar6->is_perror == true) {
      pLVar5 = operator<<(this,(char (*) [3])0x616c5f);
      base_internal::StrError_abi_cxx11_
                ((string *)&expected_seen_fatal,
                 (base_internal *)(ulong)(uint)(this->errno_saver_).saved_errno_,errnum);
      operator<<(pLVar5,(string *)&expected_seen_fatal);
      pLVar5 = operator<<(pLVar5,(char (*) [3])0x63b8ce);
      pLVar5 = operator<<(pLVar5,(this->errno_saver_).saved_errno_);
      operator<<(pLVar5,(char (*) [2])0x478e55);
      std::__cxx11::string::~string((string *)&expected_seen_fatal);
      pLVar6 = (this->data_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl;
    }
    if ((pLVar6->entry).severity_ == kFatal) {
      bVar3 = ExitOnDFatal();
      if (bVar3) {
        expected_seen_fatal = false;
        bVar3 = std::atomic<bool>::compare_exchange_strong
                          (&Flush::seen_fatal,&expected_seen_fatal,true,memory_order_relaxed);
        if (bVar3) {
          ((this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl)->first_fatal = true;
        }
      }
    }
    LogMessageData::FinalizeEncodingAndFormat
              ((this->data_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl);
    pLVar6 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    pSVar7 = LogMessageData::encoded_remaining(pLVar6);
    pLVar2 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    (pLVar2->entry).encoding_._M_len = (size_t)(pSVar7->ptr_ + (-0x230 - (long)pLVar2));
    *(array<char,_15000UL> **)((long)&(pLVar2->entry).encoding_ + 8) = &pLVar6->encoded_buf;
    SendToLog(this);
  }
  return;
}

Assistant:

void LogMessage::Flush() {
  if (data_->entry.log_severity() < absl::MinLogLevel()) return;

  if (data_->is_perror) {
    InternalStream() << ": " << absl::base_internal::StrError(errno_saver_())
                     << " [" << errno_saver_() << "]";
  }

  // Have we already seen a fatal message?
  ABSL_CONST_INIT static std::atomic<bool> seen_fatal(false);
  if (data_->entry.log_severity() == absl::LogSeverity::kFatal &&
      absl::log_internal::ExitOnDFatal()) {
    // Exactly one LOG(FATAL) message is responsible for aborting the process,
    // even if multiple threads LOG(FATAL) concurrently.
    bool expected_seen_fatal = false;
    if (seen_fatal.compare_exchange_strong(expected_seen_fatal, true,
                                           std::memory_order_relaxed)) {
      data_->first_fatal = true;
    }
  }

  data_->FinalizeEncodingAndFormat();
  data_->entry.encoding_ =
      absl::string_view(data_->encoded_buf.data(),
                        static_cast<size_t>(data_->encoded_remaining().data() -
                                            data_->encoded_buf.data()));
  SendToLog();
}